

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O0

ssize_t __thiscall nanovdb::io::Segment::read(Segment *this,int __fd,void *__buf,size_t __nbytes)

{
  uint64_t uVar1;
  bool bVar2;
  ulong uVar3;
  uint64_t uVar4;
  runtime_error *prVar5;
  ostream *poVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined7 extraout_var;
  reference this_00;
  ulong __nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  GridMetaData *m;
  iterator __end2;
  iterator __begin2;
  vector<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_> *__range2;
  stringstream ss;
  Header h;
  vector<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>
  *in_stack_fffffffffffffd78;
  __normal_iterator<nanovdb::io::GridMetaData_*,_std::vector<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>_>
  *in_stack_fffffffffffffd80;
  size_type in_stack_fffffffffffffd98;
  vector<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>
  *in_stack_fffffffffffffda0;
  __normal_iterator<nanovdb::io::GridMetaData_*,_std::vector<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>_>
  local_218;
  vector<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_> *local_210;
  undefined1 local_201;
  string local_1e0 [32];
  stringstream local_1c0 [16];
  ostream local_1b0 [392];
  Header local_28;
  long *local_18;
  Segment *local_10;
  undefined1 local_1;
  
  local_18 = (long *)CONCAT44(in_register_00000034,__fd);
  local_10 = this;
  std::istream::read((char *)local_18,(long)this);
  uVar3 = std::ios::eof();
  if ((uVar3 & 1) == 0) {
    Header::Header(&local_28,NONE);
    uVar3 = std::ios::operator!((ios *)((long)local_18 + *(long *)(*local_18 + -0x18)));
    if (((uVar3 & 1) != 0) || ((this->header).magic != 0x304244566f6e614e)) {
      uVar1 = (this->header).magic;
      uVar4 = reverseEndianness(0x304244566f6e614e);
      if (uVar1 == uVar4) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"This nvdb file has opposite endianness");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"Magic number error: This is not a valid nvdb file");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    __nbytes_00 = (ulong)local_28.major;
    if ((this->header).major != local_28.major) {
      std::__cxx11::stringstream::stringstream(local_1c0);
      poVar6 = std::operator<<(local_1b0,"Read version ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(this->header).major);
      poVar6 = std::operator<<(poVar6,".");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(this->header).minor);
      poVar6 = std::operator<<(poVar6," but expected version ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_28.major);
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::operator<<(poVar6,".x");
      std::ostream::operator<<(__rhs,std::endl<char,std::char_traits<char>>);
      local_201 = 1;
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      std::operator+((char *)poVar6,__rhs);
      std::runtime_error::runtime_error(prVar5,local_1e0);
      local_201 = 0;
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::vector<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>::resize
              (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    local_210 = &this->meta;
    local_218._M_current =
         (GridMetaData *)
         std::vector<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>::begin
                   (in_stack_fffffffffffffd78);
    std::vector<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>::end
              (in_stack_fffffffffffffd78);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (in_stack_fffffffffffffd80,
                         (__normal_iterator<nanovdb::io::GridMetaData_*,_std::vector<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>_>
                          *)in_stack_fffffffffffffd78);
      uVar3 = CONCAT71(extraout_var,bVar2);
      if (!bVar2) break;
      this_00 = __gnu_cxx::
                __normal_iterator<nanovdb::io::GridMetaData_*,_std::vector<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>_>
                ::operator*(&local_218);
      GridMetaData::read(this_00,(int)local_18,__buf_00,__nbytes_00);
      __gnu_cxx::
      __normal_iterator<nanovdb::io::GridMetaData_*,_std::vector<nanovdb::io::GridMetaData,_std::allocator<nanovdb::io::GridMetaData>_>_>
      ::operator++(&local_218);
    }
    local_1 = 1;
  }
  else {
    local_1 = 0;
  }
  return CONCAT71((int7)(uVar3 >> 8),local_1);
}

Assistant:

inline bool Segment::read(std::istream& is)
{
    is.read(reinterpret_cast<char*>(&header), sizeof(Header));
    if (is.eof())
        return false;
    Header h;
    if (!is || header.magic != NANOVDB_MAGIC_NUMBER) {
        // first check for byte-swapped header magic.
        if (header.magic == reverseEndianness(NANOVDB_MAGIC_NUMBER))
            throw std::runtime_error("This nvdb file has opposite endianness");
        throw std::runtime_error("Magic number error: This is not a valid nvdb file");
    }
    if (header.major != h.major) {
        std::stringstream ss;
        ss << "Read version " << header.major << "." << header.minor
           << " but expected version " << h.major << ".x" << std::endl;
        throw std::runtime_error("Incompatible file format: " + ss.str());
    }
    meta.resize(header.gridCount);
    for (auto& m : meta)
        m.read(is);
    return true;
}